

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O0

Expression __thiscall cnn::RNNBuilder::add_input(RNNBuilder *this,Expression *x)

{
  int *piVar1;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  RNNStateMachine *in_RSI;
  ComputationGraph *in_RDI;
  Expression EVar2;
  int rcp;
  ComputationGraph *__x;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  
  __x = in_RDI;
  RNNStateMachine::transition(in_RSI,(RNNOp)((ulong)in_RDI >> 0x20));
  std::vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>::push_back
            ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(value_type *)__x);
  piVar1 = RNNPointer::operator_cast_to_int_((RNNPointer *)(in_RSI + 2));
  iVar3 = *piVar1;
  std::vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>::size
            ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)(in_RSI + 4));
  RNNPointer::operator=((RNNPointer *)(in_RSI + 2),(int *)&stack0xffffffffffffffe0);
  (**(code **)(*(long *)in_RSI + 0x58))(in_RDI,in_RSI,iVar3,in_RDX);
  EVar2._8_8_ = extraout_RDX;
  EVar2.pg = __x;
  return EVar2;
}

Assistant:

Expression add_input(const Expression& x) {
    sm.transition(RNNOp::add_input);
    head.push_back(cur);
    int rcp = cur;
    cur = head.size() - 1;
    return add_input_impl(rcp, x);
  }